

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_settings.cpp
# Opt level: O2

entry * libtorrent::dht::save_dht_settings(entry *__return_storage_ptr__,dht_settings *settings)

{
  bool bVar1;
  int iVar2;
  map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void> *this;
  mapped_type *pmVar3;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  entry::entry(__return_storage_ptr__);
  this = (map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void> *)
         entry::dict_abi_cxx11_(__return_storage_ptr__);
  iVar2 = settings->max_peers_reply;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"max_peers_reply",&local_41);
  pmVar3 = boost::container::
           map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>::
           priv_subscript<std::__cxx11::string>(this,&local_40);
  entry::operator=(pmVar3,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_40);
  iVar2 = settings->search_branching;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"search_branching",&local_41);
  pmVar3 = boost::container::
           map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>::
           priv_subscript<std::__cxx11::string>(this,&local_40);
  entry::operator=(pmVar3,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_40);
  iVar2 = settings->max_fail_count;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"max_fail_count",&local_41);
  pmVar3 = boost::container::
           map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>::
           priv_subscript<std::__cxx11::string>(this,&local_40);
  entry::operator=(pmVar3,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_40);
  iVar2 = settings->max_torrents;
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"max_torrents",&local_41)
  ;
  pmVar3 = boost::container::
           map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>::
           priv_subscript<std::__cxx11::string>(this,&local_40);
  entry::operator=(pmVar3,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_40);
  iVar2 = settings->max_dht_items;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"max_dht_items",&local_41);
  pmVar3 = boost::container::
           map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>::
           priv_subscript<std::__cxx11::string>(this,&local_40);
  entry::operator=(pmVar3,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_40);
  iVar2 = settings->max_peers;
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"max_peers",&local_41);
  pmVar3 = boost::container::
           map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>::
           priv_subscript<std::__cxx11::string>(this,&local_40);
  entry::operator=(pmVar3,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_40);
  iVar2 = settings->max_torrent_search_reply;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"max_torrent_search_reply",&local_41);
  pmVar3 = boost::container::
           map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>::
           priv_subscript<std::__cxx11::string>(this,&local_40);
  entry::operator=(pmVar3,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_40);
  bVar1 = settings->restrict_routing_ips;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"restrict_routing_ips",&local_41);
  pmVar3 = boost::container::
           map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>::
           priv_subscript<std::__cxx11::string>(this,&local_40);
  entry::operator=(pmVar3,(ulong)bVar1);
  ::std::__cxx11::string::~string((string *)&local_40);
  bVar1 = settings->restrict_search_ips;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"restrict_search_ips",&local_41);
  pmVar3 = boost::container::
           map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>::
           priv_subscript<std::__cxx11::string>(this,&local_40);
  entry::operator=(pmVar3,(ulong)bVar1);
  ::std::__cxx11::string::~string((string *)&local_40);
  bVar1 = settings->extended_routing_table;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"extended_routing_table",&local_41);
  pmVar3 = boost::container::
           map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>::
           priv_subscript<std::__cxx11::string>(this,&local_40);
  entry::operator=(pmVar3,(ulong)bVar1);
  ::std::__cxx11::string::~string((string *)&local_40);
  bVar1 = settings->aggressive_lookups;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"aggressive_lookups",&local_41);
  pmVar3 = boost::container::
           map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>::
           priv_subscript<std::__cxx11::string>(this,&local_40);
  entry::operator=(pmVar3,(ulong)bVar1);
  ::std::__cxx11::string::~string((string *)&local_40);
  bVar1 = settings->privacy_lookups;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"privacy_lookups",&local_41);
  pmVar3 = boost::container::
           map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>::
           priv_subscript<std::__cxx11::string>(this,&local_40);
  entry::operator=(pmVar3,(ulong)bVar1);
  ::std::__cxx11::string::~string((string *)&local_40);
  bVar1 = settings->enforce_node_id;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"enforce_node_id",&local_41);
  pmVar3 = boost::container::
           map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>::
           priv_subscript<std::__cxx11::string>(this,&local_40);
  entry::operator=(pmVar3,(ulong)bVar1);
  ::std::__cxx11::string::~string((string *)&local_40);
  bVar1 = settings->ignore_dark_internet;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"ignore_dark_internet",&local_41);
  pmVar3 = boost::container::
           map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>::
           priv_subscript<std::__cxx11::string>(this,&local_40);
  entry::operator=(pmVar3,(ulong)bVar1);
  ::std::__cxx11::string::~string((string *)&local_40);
  iVar2 = settings->block_timeout;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"block_timeout",&local_41);
  pmVar3 = boost::container::
           map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>::
           priv_subscript<std::__cxx11::string>(this,&local_40);
  entry::operator=(pmVar3,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_40);
  iVar2 = settings->block_ratelimit;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"block_ratelimit",&local_41);
  pmVar3 = boost::container::
           map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>::
           priv_subscript<std::__cxx11::string>(this,&local_40);
  entry::operator=(pmVar3,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_40);
  bVar1 = settings->read_only;
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"read_only",&local_41);
  pmVar3 = boost::container::
           map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>::
           priv_subscript<std::__cxx11::string>(this,&local_40);
  entry::operator=(pmVar3,(ulong)bVar1);
  ::std::__cxx11::string::~string((string *)&local_40);
  iVar2 = settings->item_lifetime;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"item_lifetime",&local_41);
  pmVar3 = boost::container::
           map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>::
           priv_subscript<std::__cxx11::string>(this,&local_40);
  entry::operator=(pmVar3,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

entry save_dht_settings(dht_settings const& settings)
	{
		entry e;
		entry::dictionary_type& dht_sett = e.dict();

		dht_sett["max_peers_reply"] = settings.max_peers_reply;
		dht_sett["search_branching"] = settings.search_branching;
		dht_sett["max_fail_count"] = settings.max_fail_count;
		dht_sett["max_torrents"] = settings.max_torrents;
		dht_sett["max_dht_items"] = settings.max_dht_items;
		dht_sett["max_peers"] = settings.max_peers;
		dht_sett["max_torrent_search_reply"] = settings.max_torrent_search_reply;
		dht_sett["restrict_routing_ips"] = settings.restrict_routing_ips;
		dht_sett["restrict_search_ips"] = settings.restrict_search_ips;
		dht_sett["extended_routing_table"] = settings.extended_routing_table;
		dht_sett["aggressive_lookups"] = settings.aggressive_lookups;
		dht_sett["privacy_lookups"] = settings.privacy_lookups;
		dht_sett["enforce_node_id"] = settings.enforce_node_id;
		dht_sett["ignore_dark_internet"] = settings.ignore_dark_internet;
		dht_sett["block_timeout"] = settings.block_timeout;
		dht_sett["block_ratelimit"] = settings.block_ratelimit;
		dht_sett["read_only"] = settings.read_only;
		dht_sett["item_lifetime"] = settings.item_lifetime;

		return e;
	}